

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporalPhaseEncodingSynapse.cpp
# Opt level: O2

void __thiscall
TemporalPhaseEncodingSynapse::TemporalPhaseEncodingSynapse
          (TemporalPhaseEncodingSynapse *this,Population *n_from,Population *n_to)

{
  TemporalPhaseEncodingSynapse_param *pTVar1;
  
  (this->super_Synapse)._vptr_Synapse = (_func_int **)&PTR_update_00130d10;
  pTVar1 = (TemporalPhaseEncodingSynapse_param *)operator_new(0x18);
  pTVar1->som_frequency = 0x28;
  *(undefined4 *)&pTVar1->som_phase = 0;
  *(undefined4 *)((long)&pTVar1->som_phase + 4) = 0;
  *(undefined4 *)&pTVar1->window_length_s = 0;
  *(undefined4 *)((long)&pTVar1->window_length_s + 4) = 0x3fe00000;
  this->param = pTVar1;
  (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  initialize(this,n_from,n_to);
  return;
}

Assistant:

TemporalPhaseEncodingSynapse::TemporalPhaseEncodingSynapse(Population* n_from, Population* n_to) : 
    param(new TemporalPhaseEncodingSynapse_param)
{
    initialize(n_from, n_to);
}